

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Buffer.cxx
# Opt level: O0

int __thiscall Fl_Text_Buffer::skip_lines(Fl_Text_Buffer *this,int startPos,int nLines)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int local_2c;
  int local_28;
  int lineCount;
  int pos;
  int gapLen;
  int nLines_local;
  int startPos_local;
  Fl_Text_Buffer *this_local;
  
  if (nLines == 0) {
    return startPos;
  }
  local_2c = 0;
  local_28 = startPos;
  do {
    if (this->mGapStart <= local_28) {
      do {
        if (this->mLength <= local_28) {
          return local_28;
        }
        iVar3 = local_28 + 1;
        iVar2 = local_28 + (this->mGapEnd - this->mGapStart);
        local_28 = iVar3;
      } while ((this->mBuf[iVar2] != '\n') || (local_2c = local_2c + 1, local_2c < nLines));
      return iVar3;
    }
    iVar2 = local_28 + 1;
    lVar1 = (long)local_28;
    local_28 = iVar2;
  } while ((this->mBuf[lVar1] != '\n') || (local_2c = local_2c + 1, local_2c != nLines));
  return iVar2;
}

Assistant:

int Fl_Text_Buffer::skip_lines(int startPos, int nLines)
{
  IS_UTF8_ALIGNED2(this, (startPos))
  
  if (nLines == 0)
    return startPos;
  
  int gapLen = mGapEnd - mGapStart;
  int pos = startPos;
  int lineCount = 0;
  while (pos < mGapStart) {
    if (mBuf[pos++] == '\n') {
      lineCount++;
      if (lineCount == nLines) {
        IS_UTF8_ALIGNED2(this, (pos))
	return pos;
      }
    }
  }
  while (pos < mLength) {
    if (mBuf[pos++ + gapLen] == '\n') {
      lineCount++;
      if (lineCount >= nLines) {
        IS_UTF8_ALIGNED2(this, (pos))
	return pos;
      }
    }
  }
  IS_UTF8_ALIGNED2(this, (pos))
  return pos;
}